

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
             ,Dispatch_State *t_ss)

{
  bool bVar1;
  const_reference this_00;
  pointer t_e;
  Type_Info *this_01;
  eval_error *this_02;
  Dispatch_Engine *pDVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar3;
  string_view t_name;
  dispatch_error *e;
  __sv_type local_98;
  Function_Params local_88;
  Function_Push_Pop local_78;
  Function_Push_Pop fpp;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  Boxed_Value bv;
  Dispatch_State *t_ss_local;
  Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this_local;
  
  bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX;
  this_00 = std::
            vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
            ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
                          *)&t_ss[2].m_conversions,0);
  t_e = std::
        unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
        ::operator->(this_00);
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             local_30,(Dispatch_State *)t_e);
  if ((*(int *)&t_ss[3].m_stack_holder._M_data != 0x20) &&
     (*(int *)&t_ss[3].m_stack_holder._M_data != 0x16)) {
    this_01 = Boxed_Value::get_type_info((Boxed_Value *)local_30);
    bVar1 = Type_Info::is_arithmetic(this_01);
    if (bVar1) {
      if (((*(int *)&t_ss[3].m_stack_holder._M_data == 7) ||
          (*(int *)&t_ss[3].m_stack_holder._M_data == 8)) &&
         (bVar1 = Boxed_Value::is_const((Boxed_Value *)local_30), bVar1)) {
        this_02 = (eval_error *)__cxa_allocate_exception(0x90);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,
                   "Error with prefix operator evaluation: cannot modify constant value.",&local_51)
        ;
        exception::eval_error::eval_error(this_02,&local_50);
        __cxa_throw(this_02,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      Boxed_Number::do_oper
                ((Boxed_Number *)this,*(Opers *)&t_ss[3].m_stack_holder._M_data,
                 (Boxed_Value *)local_30);
      fpp.m_ds._4_4_ = 1;
      goto LAB_003fac4c;
    }
  }
  detail::Function_Push_Pop::Function_Push_Pop
            (&local_78,
             (Dispatch_State *)
             bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  Function_Params::Function_Params(&local_88,(Boxed_Value *)local_30);
  detail::Function_Push_Pop::save_params(&local_78,&local_88);
  pDVar2 = chaiscript::detail::Dispatch_State::operator->
                     ((Dispatch_State *)
                      bv.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  local_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&t_ss->m_conversions);
  Function_Params::Function_Params((Function_Params *)&e,(Boxed_Value *)local_30);
  chaiscript::detail::Dispatch_State::conversions
            ((Dispatch_State *)
             bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  t_name._M_str = (char *)local_98._M_len;
  t_name._M_len = (size_t)pDVar2;
  chaiscript::detail::Dispatch_Engine::call_function
            ((Dispatch_Engine *)this,t_name,(atomic_uint_fast32_t *)local_98._M_str,
             (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&e);
  fpp.m_ds._4_4_ = 1;
  detail::Function_Push_Pop::~Function_Push_Pop(&local_78);
LAB_003fac4c:
  Boxed_Value::~Boxed_Value((Boxed_Value *)local_30);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        Boxed_Value bv(this->children[0]->eval(t_ss));

        try {
          // short circuit arithmetic operations
          if (m_oper != Operators::Opers::invalid && m_oper != Operators::Opers::bitwise_and && bv.get_type_info().is_arithmetic()) {
            if ((m_oper == Operators::Opers::pre_increment || m_oper == Operators::Opers::pre_decrement) && bv.is_const()) {
              throw exception::eval_error("Error with prefix operator evaluation: cannot modify constant value.");
            }
            return Boxed_Number::do_oper(m_oper, bv);
          } else {
            chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
            fpp.save_params(Function_Params{bv});
            return t_ss->call_function(this->text, m_loc, Function_Params{bv}, t_ss.conversions());
          }
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error("Error with prefix operator evaluation: '" + this->text + "'", e.parameters, e.functions, false, *t_ss);
        }
      }